

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

int QEMU_AES_set_encrypt_key(uchar *userKey,int bits,AES_KEY *key)

{
  uint uVar1;
  int local_34;
  u32 temp;
  int i;
  u32 *rk;
  AES_KEY *key_local;
  int bits_local;
  uchar *userKey_local;
  
  local_34 = 0;
  if ((userKey == (uchar *)0x0) || (key == (AES_KEY *)0x0)) {
    userKey_local._4_4_ = -1;
  }
  else if (((bits == 0x80) || (bits == 0xc0)) || (bits == 0x100)) {
    if (bits == 0x80) {
      key->rounds = 10;
    }
    else if (bits == 0xc0) {
      key->rounds = 0xc;
    }
    else {
      key->rounds = 0xe;
    }
    key->rd_key[0] =
         (uint)*userKey << 0x18 ^ (uint)userKey[1] << 0x10 ^ (uint)userKey[2] << 8 ^
         (uint)userKey[3];
    key->rd_key[1] =
         (uint)userKey[4] << 0x18 ^ (uint)userKey[5] << 0x10 ^ (uint)userKey[6] << 8 ^
         (uint)userKey[7];
    key->rd_key[2] =
         (uint)userKey[8] << 0x18 ^ (uint)userKey[9] << 0x10 ^ (uint)userKey[10] << 8 ^
         (uint)userKey[0xb];
    key->rd_key[3] =
         (uint)userKey[0xc] << 0x18 ^ (uint)userKey[0xd] << 0x10 ^ (uint)userKey[0xe] << 8 ^
         (uint)userKey[0xf];
    _temp = key;
    if (bits == 0x80) {
      while( true ) {
        uVar1 = _temp->rd_key[3];
        _temp->rd_key[4] =
             _temp->rd_key[0] ^ AES_Te4[uVar1 >> 0x10 & 0xff] & 0xff000000 ^
             AES_Te4[uVar1 >> 8 & 0xff] & 0xff0000 ^ AES_Te4[uVar1 & 0xff] & 0xff00 ^
             AES_Te4[uVar1 >> 0x18] & 0xff ^ rcon[local_34];
        _temp->rd_key[5] = _temp->rd_key[1] ^ _temp->rd_key[4];
        _temp->rd_key[6] = _temp->rd_key[2] ^ _temp->rd_key[5];
        _temp->rd_key[7] = _temp->rd_key[3] ^ _temp->rd_key[6];
        local_34 = local_34 + 1;
        if (local_34 == 10) break;
        _temp = (AES_KEY *)(_temp->rd_key + 4);
      }
      userKey_local._4_4_ = 0;
    }
    else {
      key->rd_key[4] =
           (uint)userKey[0x10] << 0x18 ^ (uint)userKey[0x11] << 0x10 ^ (uint)userKey[0x12] << 8 ^
           (uint)userKey[0x13];
      key->rd_key[5] =
           (uint)userKey[0x14] << 0x18 ^ (uint)userKey[0x15] << 0x10 ^ (uint)userKey[0x16] << 8 ^
           (uint)userKey[0x17];
      if (bits == 0xc0) {
        while( true ) {
          uVar1 = _temp->rd_key[5];
          _temp->rd_key[6] =
               _temp->rd_key[0] ^ AES_Te4[uVar1 >> 0x10 & 0xff] & 0xff000000 ^
               AES_Te4[uVar1 >> 8 & 0xff] & 0xff0000 ^ AES_Te4[uVar1 & 0xff] & 0xff00 ^
               AES_Te4[uVar1 >> 0x18] & 0xff ^ rcon[local_34];
          _temp->rd_key[7] = _temp->rd_key[1] ^ _temp->rd_key[6];
          _temp->rd_key[8] = _temp->rd_key[2] ^ _temp->rd_key[7];
          _temp->rd_key[9] = _temp->rd_key[3] ^ _temp->rd_key[8];
          local_34 = local_34 + 1;
          if (local_34 == 8) break;
          _temp->rd_key[10] = _temp->rd_key[4] ^ _temp->rd_key[9];
          _temp->rd_key[0xb] = _temp->rd_key[5] ^ _temp->rd_key[10];
          _temp = (AES_KEY *)(_temp->rd_key + 6);
        }
        userKey_local._4_4_ = 0;
      }
      else {
        key->rd_key[6] =
             (uint)userKey[0x18] << 0x18 ^ (uint)userKey[0x19] << 0x10 ^ (uint)userKey[0x1a] << 8 ^
             (uint)userKey[0x1b];
        key->rd_key[7] =
             (uint)userKey[0x1c] << 0x18 ^ (uint)userKey[0x1d] << 0x10 ^ (uint)userKey[0x1e] << 8 ^
             (uint)userKey[0x1f];
        if (bits != 0x100) {
          abort();
        }
        while( true ) {
          uVar1 = _temp->rd_key[7];
          _temp->rd_key[8] =
               _temp->rd_key[0] ^ AES_Te4[uVar1 >> 0x10 & 0xff] & 0xff000000 ^
               AES_Te4[uVar1 >> 8 & 0xff] & 0xff0000 ^ AES_Te4[uVar1 & 0xff] & 0xff00 ^
               AES_Te4[uVar1 >> 0x18] & 0xff ^ rcon[local_34];
          _temp->rd_key[9] = _temp->rd_key[1] ^ _temp->rd_key[8];
          _temp->rd_key[10] = _temp->rd_key[2] ^ _temp->rd_key[9];
          _temp->rd_key[0xb] = _temp->rd_key[3] ^ _temp->rd_key[10];
          local_34 = local_34 + 1;
          if (local_34 == 7) break;
          uVar1 = _temp->rd_key[0xb];
          _temp->rd_key[0xc] =
               _temp->rd_key[4] ^ AES_Te4[uVar1 >> 0x18] & 0xff000000 ^
               AES_Te4[uVar1 >> 0x10 & 0xff] & 0xff0000 ^ AES_Te4[uVar1 >> 8 & 0xff] & 0xff00 ^
               AES_Te4[uVar1 & 0xff] & 0xff;
          _temp->rd_key[0xd] = _temp->rd_key[5] ^ _temp->rd_key[0xc];
          _temp->rd_key[0xe] = _temp->rd_key[6] ^ _temp->rd_key[0xd];
          _temp->rd_key[0xf] = _temp->rd_key[7] ^ _temp->rd_key[0xe];
          _temp = (AES_KEY *)(_temp->rd_key + 8);
        }
        userKey_local._4_4_ = 0;
      }
    }
  }
  else {
    userKey_local._4_4_ = -2;
  }
  return userKey_local._4_4_;
}

Assistant:

int AES_set_encrypt_key(const unsigned char *userKey, const int bits,
                        AES_KEY *key) {

        u32 *rk;
        int i = 0;
        u32 temp;

        if (!userKey || !key)
                return -1;
        if (bits != 128 && bits != 192 && bits != 256)
                return -2;

        rk = key->rd_key;

        if (bits==128)
                key->rounds = 10;
        else if (bits==192)
                key->rounds = 12;
        else
                key->rounds = 14;

        rk[0] = GETU32(userKey     );
        rk[1] = GETU32(userKey +  4);
        rk[2] = GETU32(userKey +  8);
        rk[3] = GETU32(userKey + 12);
        if (bits == 128) {
                while (1) {
                        temp  = rk[3];
                        rk[4] = rk[0] ^
                                (AES_Te4[(temp >> 16) & 0xff] & 0xff000000) ^
                                (AES_Te4[(temp >>  8) & 0xff] & 0x00ff0000) ^
                                (AES_Te4[(temp      ) & 0xff] & 0x0000ff00) ^
                                (AES_Te4[(temp >> 24)       ] & 0x000000ff) ^
                                rcon[i];
                        rk[5] = rk[1] ^ rk[4];
                        rk[6] = rk[2] ^ rk[5];
                        rk[7] = rk[3] ^ rk[6];
                        if (++i == 10) {
                                return 0;
                        }
                        rk += 4;
                }
        }
        rk[4] = GETU32(userKey + 16);
        rk[5] = GETU32(userKey + 20);
        if (bits == 192) {
                while (1) {
                        temp = rk[ 5];
                        rk[ 6] = rk[ 0] ^
                                (AES_Te4[(temp >> 16) & 0xff] & 0xff000000) ^
                                (AES_Te4[(temp >>  8) & 0xff] & 0x00ff0000) ^
                                (AES_Te4[(temp      ) & 0xff] & 0x0000ff00) ^
                                (AES_Te4[(temp >> 24)       ] & 0x000000ff) ^
                                rcon[i];
                        rk[ 7] = rk[ 1] ^ rk[ 6];
                        rk[ 8] = rk[ 2] ^ rk[ 7];
                        rk[ 9] = rk[ 3] ^ rk[ 8];
                        if (++i == 8) {
                                return 0;
                        }
                        rk[10] = rk[ 4] ^ rk[ 9];
                        rk[11] = rk[ 5] ^ rk[10];
                        rk += 6;
                }
        }
        rk[6] = GETU32(userKey + 24);
        rk[7] = GETU32(userKey + 28);
        if (bits == 256) {
                while (1) {
                        temp = rk[ 7];
                        rk[ 8] = rk[ 0] ^
                                (AES_Te4[(temp >> 16) & 0xff] & 0xff000000) ^
                                (AES_Te4[(temp >>  8) & 0xff] & 0x00ff0000) ^
                                (AES_Te4[(temp      ) & 0xff] & 0x0000ff00) ^
                                (AES_Te4[(temp >> 24)       ] & 0x000000ff) ^
                                rcon[i];
                        rk[ 9] = rk[ 1] ^ rk[ 8];
                        rk[10] = rk[ 2] ^ rk[ 9];
                        rk[11] = rk[ 3] ^ rk[10];
                        if (++i == 7) {
                                return 0;
                        }
                        temp = rk[11];
                        rk[12] = rk[ 4] ^
                                (AES_Te4[(temp >> 24)       ] & 0xff000000) ^
                                (AES_Te4[(temp >> 16) & 0xff] & 0x00ff0000) ^
                                (AES_Te4[(temp >>  8) & 0xff] & 0x0000ff00) ^
                                (AES_Te4[(temp      ) & 0xff] & 0x000000ff);
                        rk[13] = rk[ 5] ^ rk[12];
                        rk[14] = rk[ 6] ^ rk[13];
                        rk[15] = rk[ 7] ^ rk[14];

                        rk += 8;
                }
        }
        abort();
}